

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeWeakMapConstructor
               (DynamicObject *weakMapConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *pJVar1;
  ScriptContext *this;
  PropertyString *pPVar2;
  
  DeferredTypeHandlerBase::Convert(typeHandler,weakMapConstructor,mode,3,0);
  pJVar1 = (((weakMapConstructor->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  this = (pJVar1->super_JavascriptLibraryBase).scriptContext.ptr;
  (*(weakMapConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (weakMapConstructor,0xd1,0x1000000000000,2,0,0,0);
  (*(weakMapConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (weakMapConstructor,0x124,(pJVar1->super_JavascriptLibraryBase).weakMapPrototype.ptr,0,0
             ,0,0);
  pPVar2 = ScriptContext::GetPropertyString(this,400);
  (*(weakMapConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (weakMapConstructor,0x106,pPVar2,2,0,0,0);
  DynamicObject::SetHasNoEnumerableProperties(weakMapConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeWeakMapConstructor(DynamicObject* weakMapConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(weakMapConstructor, mode, 3);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterWeakMap
        // so that the update is in sync with profiler
        JavascriptLibrary* library = weakMapConstructor->GetLibrary();
        ScriptContext* scriptContext = weakMapConstructor->GetScriptContext();
        library->AddMember(weakMapConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(0), PropertyConfigurable);
        library->AddMember(weakMapConstructor, PropertyIds::prototype, library->weakMapPrototype, PropertyNone);
        library->AddMember(weakMapConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::WeakMap), PropertyConfigurable);

        weakMapConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }